

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

DistanceType __thiscall
nanoflann::
L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>
::evalMetric(L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>
             *this,float *a,uint b_idx,size_t size,DistanceType worst_dist)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int dim;
  int dim_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  DistanceType diff0_1;
  DistanceType diff3;
  DistanceType diff2;
  DistanceType diff1;
  DistanceType diff0;
  size_t d;
  float *lastgroup;
  float *last;
  DistanceType result;
  DistanceType worst_dist_local;
  size_t size_local;
  float *pfStack_20;
  uint b_idx_local;
  float *a_local;
  L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>
  *this_local;
  
  last._0_4_ = 0.0;
  dim = 0;
  pfStack_20 = a;
  do {
    if (a + size + -3 <= pfStack_20) {
      while (pfStack_20 < a + size) {
        fVar1 = *pfStack_20;
        fVar8 = eos::fitting::
                KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
                ::kdtree_get_pt(this->data_source,(ulong)b_idx,dim);
        last._0_4_ = (fVar1 - fVar8) * (fVar1 - fVar8) + last._0_4_;
        pfStack_20 = pfStack_20 + 1;
        dim = dim + 1;
      }
      return last._0_4_;
    }
    fVar1 = *pfStack_20;
    fVar4 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,(ulong)b_idx,dim);
    fVar8 = pfStack_20[1];
    fVar5 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,(ulong)b_idx,dim + 1);
    fVar2 = pfStack_20[2];
    dim_00 = dim + 3;
    fVar6 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,(ulong)b_idx,dim + 2);
    fVar3 = pfStack_20[3];
    dim = dim + 4;
    fVar7 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,(ulong)b_idx,dim_00);
    last._0_4_ = (fVar3 - fVar7) * (fVar3 - fVar7) +
                 (fVar2 - fVar6) * (fVar2 - fVar6) +
                 (fVar1 - fVar4) * (fVar1 - fVar4) + (fVar8 - fVar5) * (fVar8 - fVar5) + last._0_4_;
    pfStack_20 = pfStack_20 + 4;
  } while ((worst_dist <= 0.0) || (last._0_4_ <= worst_dist));
  return last._0_4_;
}

Assistant:

inline DistanceType evalMetric(
        const T* a, const AccessorType b_idx, size_t size,
        DistanceType worst_dist = -1) const
    {
        DistanceType result    = DistanceType();
        const T*     last      = a + size;
        const T*     lastgroup = last - 3;
        size_t       d         = 0;

        /* Process 4 items with each loop for efficiency. */
        while (a < lastgroup)
        {
            const DistanceType diff0 =
                a[0] - data_source.kdtree_get_pt(b_idx, d++);
            const DistanceType diff1 =
                a[1] - data_source.kdtree_get_pt(b_idx, d++);
            const DistanceType diff2 =
                a[2] - data_source.kdtree_get_pt(b_idx, d++);
            const DistanceType diff3 =
                a[3] - data_source.kdtree_get_pt(b_idx, d++);
            result +=
                diff0 * diff0 + diff1 * diff1 + diff2 * diff2 + diff3 * diff3;
            a += 4;
            if ((worst_dist > 0) && (result > worst_dist)) { return result; }
        }
        /* Process last 0-3 components.  Not needed for standard vector lengths.
         */
        while (a < last)
        {
            const DistanceType diff0 =
                *a++ - data_source.kdtree_get_pt(b_idx, d++);
            result += diff0 * diff0;
        }
        return result;
    }